

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_3389b47::File::~File(File *this)

{
  __int_type_conflict _Var1;
  
  (this->super_ReaderWriter).super_Reader = (Reader)&PTR__File_00bcf1d0;
  (this->super_ReaderWriter).super_Writer = (Writer)&PTR__File_00bcf230;
  if (this->closable == true) {
    LOCK();
    _Var1 = (this->closed)._M_base._M_i;
    (this->closed)._M_base._M_i = true;
    UNLOCK();
    if ((_Var1 & 1U) == 0) {
      fclose((FILE *)this->f);
    }
  }
  operator_delete(this,0x78);
  return;
}

Assistant:

~File() { close(); }